

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O3

void __thiscall duckdb::SQLLogicTestLogger::PrintSQLFormatted(SQLLogicTestLogger *this)

{
  SimplifiedTokenType SVar1;
  int iVar2;
  long lVar3;
  reference pvVar4;
  long lVar5;
  char *pcVar6;
  size_type __n;
  vector<duckdb::SimplifiedToken,_true> tokens;
  void *local_68;
  void *local_60;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  if (_stderr == (FILE *)0x0) {
LAB_00463034:
    lVar3 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar3)) {
      lVar3 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar3);
    }
    else {
      lVar3 = std::ios_base::_M_grow_words
                        ((int)lVar3 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar3 + 8) != 0) goto LAB_00463076;
  }
  else {
    iVar2 = fileno(_stderr);
    iVar2 = isatty(iVar2);
    if (iVar2 == 0) goto LAB_00463034;
LAB_00463076:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1m",4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"SQL Query",9);
  if (_stderr == (FILE *)0x0) {
LAB_004630c8:
    lVar3 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar3)) {
      lVar3 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar3);
    }
    else {
      lVar3 = std::ios_base::_M_grow_words
                        ((int)lVar3 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar3 + 8) == 0) goto LAB_0046311c;
  }
  else {
    iVar2 = fileno(_stderr);
    iVar2 = isatty(iVar2);
    if (iVar2 == 0) goto LAB_004630c8;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[00m",5);
LAB_0046311c:
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  duckdb::Parser::Tokenize((string *)&local_68);
  if (local_60 != local_68) {
    __n = 0;
    do {
      pvVar4 = vector<duckdb::SimplifiedToken,_true>::operator[]
                         ((vector<duckdb::SimplifiedToken,_true> *)&local_68,__n);
      __n = __n + 1;
      if (__n < (ulong)((long)local_60 - (long)local_68 >> 4)) {
        vector<duckdb::SimplifiedToken,_true>::operator[]
                  ((vector<duckdb::SimplifiedToken,_true> *)&local_68,__n);
      }
      SVar1 = pvVar4->type;
      if (SVar1 - 1 < 2) {
        if (_stderr == (FILE *)0x0) {
LAB_0046324f:
          lVar3 = *(long *)(std::cerr + -0x18);
          if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar3))
          {
            lVar5 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
                    *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar3);
          }
          else {
            lVar5 = std::ios_base::_M_grow_words
                              ((int)lVar3 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
          }
          lVar3 = 5;
          lVar5 = *(long *)(lVar5 + 8);
          pcVar6 = "\x1b[33m";
          goto joined_r0x004632e1;
        }
        iVar2 = fileno(_stderr);
        iVar2 = isatty(iVar2);
        lVar3 = 5;
        pcVar6 = "\x1b[33m";
        if (iVar2 == 0) goto LAB_0046324f;
LAB_004633ae:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar3);
      }
      else if (SVar1 == SIMPLIFIED_TOKEN_KEYWORD) {
        if (_stderr == (FILE *)0x0) {
LAB_0046329b:
          lVar3 = *(long *)(std::cerr + -0x18);
          if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar3))
          {
            lVar3 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
                    *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar3);
          }
          else {
            lVar3 = std::ios_base::_M_grow_words
                              ((int)lVar3 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
          }
          if (*(long *)(lVar3 + 8) != 0) goto LAB_00463327;
        }
        else {
          iVar2 = fileno(_stderr);
          iVar2 = isatty(iVar2);
          if (iVar2 == 0) goto LAB_0046329b;
LAB_00463327:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[32m",5);
        }
        if (_stderr != (FILE *)0x0) {
          iVar2 = fileno(_stderr);
          iVar2 = isatty(iVar2);
          lVar3 = 4;
          pcVar6 = "\x1b[1m";
          if (iVar2 != 0) goto LAB_004633ae;
        }
        lVar3 = *(long *)(std::cerr + -0x18);
        if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar3)) {
          lVar5 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
                  *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar3);
        }
        else {
          lVar5 = std::ios_base::_M_grow_words
                            ((int)lVar3 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
        }
        lVar3 = 4;
        lVar5 = *(long *)(lVar5 + 8);
        pcVar6 = "\x1b[1m";
joined_r0x004632e1:
        if (lVar5 != 0) goto LAB_004633ae;
      }
      else if (SVar1 == SIMPLIFIED_TOKEN_COMMENT) {
        if (_stderr != (FILE *)0x0) {
          iVar2 = fileno(_stderr);
          iVar2 = isatty(iVar2);
          lVar3 = 5;
          pcVar6 = "\x1b[30m";
          if (iVar2 != 0) goto LAB_004633ae;
        }
        lVar3 = *(long *)(std::cerr + -0x18);
        if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar3)) {
          lVar5 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
                  *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar3);
        }
        else {
          lVar5 = std::ios_base::_M_grow_words
                            ((int)lVar3 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
        }
        lVar3 = 5;
        lVar5 = *(long *)(lVar5 + 8);
        pcVar6 = "\x1b[30m";
        goto joined_r0x004632e1;
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&this->sql_query);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (_stderr == (FILE *)0x0) {
LAB_00463412:
        lVar3 = *(long *)(std::cerr + -0x18);
        if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar3)) {
          lVar3 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
                  *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar3);
        }
        else {
          lVar3 = std::ios_base::_M_grow_words
                            ((int)lVar3 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
        }
        if (*(long *)(lVar3 + 8) != 0) goto LAB_0046344e;
      }
      else {
        iVar2 = fileno(_stderr);
        iVar2 = isatty(iVar2);
        if (iVar2 == 0) goto LAB_00463412;
LAB_0046344e:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[00m",5);
      }
    } while (__n < (ulong)((long)local_60 - (long)local_68 >> 4));
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (local_68 != (void *)0x0) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void SQLLogicTestLogger::PrintSQLFormatted() {
	std::cerr << termcolor::bold << "SQL Query" << termcolor::reset << std::endl;
	auto tokens = Parser::Tokenize(sql_query);
	for (idx_t i = 0; i < tokens.size(); i++) {
		auto &token = tokens[i];
		idx_t next = i + 1 < tokens.size() ? tokens[i + 1].start : sql_query.size();
		// adjust the highlighting based on the type
		switch (token.type) {
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_IDENTIFIER:
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_ERROR:
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_NUMERIC_CONSTANT:
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_STRING_CONSTANT:
			std::cerr << termcolor::yellow;
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_OPERATOR:
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_KEYWORD:
			std::cerr << termcolor::green << termcolor::bold;
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_COMMENT:
			std::cerr << termcolor::grey;
			break;
		}
		// print the current token
		std::cerr << sql_query.substr(token.start, next - token.start);
		// reset and move to the next token
		std::cerr << termcolor::reset;
	}
	std::cerr << std::endl;
}